

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnShadedPalCommand::Execute
          (DrawColumnShadedPalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int pitch_00;
  int iVar4;
  uchar *dest_00;
  uint8_t *puVar5;
  uint8_t *puVar6;
  int iVar7;
  uint uVar8;
  uint32_t fg;
  uint32_t val;
  uint32_t *fgstart;
  uint8_t *colormap;
  uint8_t *source;
  int pitch;
  fixed_t fracstep;
  fixed_t frac;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  DrawColumnShadedPalCommand *this_local;
  
  dest_00 = (this->super_PalColumnCommand)._dest;
  iVar2 = (this->super_PalColumnCommand)._iscale;
  iVar3 = (this->super_PalColumnCommand)._texturefrac;
  dest._4_4_ = DrawerThread::count_for_thread
                         (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                          *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < dest._4_4_) {
    pitch_00 = (this->super_PalColumnCommand)._pitch;
    _fracstep = DrawerThread::dest_for_thread<unsigned_char>
                          (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                           pitch_00,dest_00);
    iVar7 = DrawerThread::skipped_by_thread
                      (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y);
    pitch = iVar2 * iVar7 + iVar3;
    iVar3 = thread->num_cores;
    iVar7 = thread->num_cores;
    puVar5 = (this->super_PalColumnCommand)._source;
    puVar6 = (this->super_PalColumnCommand)._colormap;
    iVar4 = (this->super_PalColumnCommand)._color;
    do {
      bVar1 = puVar6[puVar5[pitch >> 0x10]];
      uVar8 = Col2RGB8[0x40 - bVar1][*_fracstep] + Col2RGB8[bVar1][iVar4] | 0x1f07c1f;
      *_fracstep = RGB32k.All[uVar8 & uVar8 >> 0xf];
      _fracstep = _fracstep + iVar7 * pitch_00;
      pitch = iVar3 * iVar2 + pitch;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void DrawColumnShadedPalCommand::Execute(DrawerThread *thread)
	{
		int  count;
		uint8_t *dest;
		fixed_t frac, fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		const uint8_t *source = _source;
		const uint8_t *colormap = _colormap;
		uint32_t *fgstart = &Col2RGB8[0][_color];

		do
		{
			uint32_t val = colormap[source[frac >> FRACBITS]];
			uint32_t fg = fgstart[val << 8];
			val = (Col2RGB8[64 - val][*dest] + fg) | 0x1f07c1f;
			*dest = RGB32k.All[val & (val >> 15)];

			dest += pitch;
			frac += fracstep;
		} while (--count);
	}